

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_atomics_isLockFree(JSContext *ctx,JSValue this_obj,int argc,JSValue *argv)

{
  JSValue val;
  JSValue JVar1;
  int iVar2;
  undefined8 in_RDX;
  JSContext *in_RSI;
  int *in_RDI;
  bool bVar3;
  int ret;
  int v;
  undefined4 local_5c;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 local_28;
  undefined4 uStack_c;
  
  val.tag._0_4_ = in_stack_ffffffffffffffd0;
  val.u = (JSValueUnion)in_RDX;
  val.tag._4_4_ = in_stack_ffffffffffffffd4;
  iVar2 = JS_ToInt32Sat(in_RSI,in_RDI,val);
  if (iVar2 == 0) {
    bVar3 = true;
    if ((local_5c != 1) && (bVar3 = true, local_5c != 2)) {
      bVar3 = local_5c == 4;
    }
    uVar4 = (uint)bVar3;
    local_28 = 1;
    in_stack_ffffffffffffffd4 = uStack_c;
  }
  else {
    uVar4 = 0;
    local_28 = 6;
  }
  JVar1.u._4_4_ = in_stack_ffffffffffffffd4;
  JVar1.u.int32 = uVar4;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_atomics_isLockFree(JSContext *ctx,
                                     JSValueConst this_obj,
                                     int argc, JSValueConst *argv)
{
    int v, ret;
    if (JS_ToInt32Sat(ctx, &v, argv[0]))
        return JS_EXCEPTION;
    ret = (v == 1 || v == 2 || v == 4
#ifdef CONFIG_BIGNUM
           || v == 8
#endif
           );
    return JS_NewBool(ctx, ret);
}